

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

GatherNDLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_gathernd(NeuralNetworkLayer *this)

{
  GatherNDLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x3ac) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3ac;
    this_00 = (GatherNDLayerParams *)operator_new(0x18);
    GatherNDLayerParams::GatherNDLayerParams(this_00);
    (this->layer_).gathernd_ = this_00;
  }
  return (GatherNDLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GatherNDLayerParams* NeuralNetworkLayer::mutable_gathernd() {
  if (!has_gathernd()) {
    clear_layer();
    set_has_gathernd();
    layer_.gathernd_ = new ::CoreML::Specification::GatherNDLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.gatherND)
  return layer_.gathernd_;
}